

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

size_t __thiscall PSymbolTable::MarkSymbols(PSymbolTable *this)

{
  uint uVar1;
  bool bVar2;
  Node *pNVar3;
  IPair *pIVar4;
  IPair *unaff_R12;
  uint uVar5;
  long lVar6;
  DObject *local_30;
  
  uVar5 = 0;
  lVar6 = 0;
  do {
    uVar1 = (this->Symbols).Size;
    if (uVar5 < uVar1) {
      pNVar3 = (this->Symbols).Nodes + uVar5;
      do {
        pIVar4 = &pNVar3->Pair;
        uVar5 = uVar5 + 1;
        if (*(long *)((long)(pIVar4 + -1) + 8) != 1) {
          bVar2 = true;
          unaff_R12 = pIVar4;
          goto LAB_00377e33;
        }
        pNVar3 = (Node *)(pIVar4 + 1);
      } while (uVar5 != uVar1);
      bVar2 = false;
      uVar5 = uVar1;
    }
    else {
      bVar2 = false;
    }
LAB_00377e33:
    if (!bVar2) {
      return lVar6 << 4;
    }
    local_30 = (DObject *)unaff_R12->Value;
    GC::Mark(&local_30);
    unaff_R12->Value = (PSymbol *)local_30;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

size_t PSymbolTable::MarkSymbols()
{
	size_t count = 0;
	MapType::Iterator it(Symbols);
	MapType::Pair *pair;

	while (it.NextPair(pair))
	{
		GC::Mark(pair->Value);
		count++;
	}
	return count * sizeof(*pair);
}